

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::t_formatter<spdlog::details::null_scoped_padder>::format
          (t_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  memory_buf_t *in_RCX;
  long in_RSI;
  memory_buf_t *in_RDI;
  unsigned_long unaff_retaddr;
  null_scoped_padder p;
  uint field_size;
  null_scoped_padder local_25;
  uint local_24;
  memory_buf_t *local_20;
  memory_buf_t *dest_00;
  
  local_20 = in_RCX;
  dest_00 = in_RDI;
  local_24 = null_scoped_padder::count_digits<unsigned_long>(*(unsigned_long *)(in_RSI + 0x20));
  null_scoped_padder::null_scoped_padder
            (&local_25,(ulong)local_24,(padding_info *)&(in_RDI->super_buffer<char>).ptr_,local_20);
  fmt_helper::append_int<unsigned_long>(unaff_retaddr,dest_00);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const auto field_size = ScopedPadder::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }